

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O3

void decSetOverflow(decNumber *dn,decContext *set,uint32_t *status)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  uint8_t *__s;
  
  if ((dn->lsu[0] == '\0') && ((dn->bits & 0x70) == 0 && dn->digits == 1)) {
    iVar1 = set->emax;
    if (set->clamp != '\0') {
      iVar1 = (iVar1 - set->digits) + 1;
    }
    if (dn->exponent <= iVar1) {
      return;
    }
    dn->exponent = iVar1;
    uVar2 = 0x400;
    goto LAB_0024a89f;
  }
  bVar3 = dn->bits & 0x80;
  dn->digits = 1;
  dn->exponent = 0;
  dn->lsu[0] = '\0';
  switch(set->round) {
  case DEC_ROUND_CEILING:
    if (bVar3 == 0) goto switchD_0024a839_caseD_1;
    break;
  default:
switchD_0024a839_caseD_1:
    bVar3 = bVar3 | 0x40;
    goto LAB_0024a896;
  case DEC_ROUND_DOWN:
  case DEC_ROUND_05UP:
    break;
  case DEC_ROUND_FLOOR:
    if (bVar3 != 0) goto switchD_0024a839_caseD_1;
  }
  __s = dn->lsu;
  iVar1 = set->digits;
  dn->digits = iVar1;
  if (1 < (long)iVar1) {
    memset(__s,9,(ulong)(iVar1 - 1));
    __s = dn->lsu + (long)iVar1 + -1;
    iVar1 = 1;
  }
  *__s = (char)DECPOWERS[iVar1] + 0xff;
  dn->exponent = (set->emax - set->digits) + 1;
LAB_0024a896:
  dn->bits = bVar3;
  uVar2 = 0xa20;
LAB_0024a89f:
  *status = *status | uVar2;
  return;
}

Assistant:

static void decSetOverflow(decNumber *dn, decContext *set, uInt *status) {
  Flag needmax=0;                  /* result is maximum finite value  */
  uByte sign=dn->bits&DECNEG;      /* clean and save sign bit  */

  if (ISZERO(dn)) {                /* zero does not overflow magnitude  */
    Int emax=set->emax;                      /* limit value  */
    if (set->clamp) emax-=set->digits-1;     /* lower if clamping  */
    if (dn->exponent>emax) {                 /* clamp required  */
      dn->exponent=emax;
      *status|=DEC_Clamped;
      }
    return;
    }

  uprv_decNumberZero(dn);
  switch (set->round) {
    case DEC_ROUND_DOWN: {
      needmax=1;                   /* never Infinity  */
      break;} /* r-d  */
    case DEC_ROUND_05UP: {
      needmax=1;                   /* never Infinity  */
      break;} /* r-05  */
    case DEC_ROUND_CEILING: {
      if (sign) needmax=1;         /* Infinity if non-negative  */
      break;} /* r-c  */
    case DEC_ROUND_FLOOR: {
      if (!sign) needmax=1;        /* Infinity if negative  */
      break;} /* r-f  */
    default: break;                /* Infinity in all other cases  */
    }
  if (needmax) {
    decSetMaxValue(dn, set);
    dn->bits=sign;                 /* set sign  */
    }
   else dn->bits=sign|DECINF;      /* Value is +/-Infinity  */
  *status|=DEC_Overflow | DEC_Inexact | DEC_Rounded;
  }